

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.h
# Opt level: O3

cmplx klogic::transform::discrete<3>(int n)

{
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  double __x;
  cmplx cVar1;
  
  if ((uint)n < 3) {
    __x = ((double)n * 6.283185307179586) / 3.0;
    cos(__x);
    sin(__x);
    cVar1._M_value._8_8_ = extraout_RDX;
    cVar1._M_value._0_8_ = extraout_RAX;
    return (cmplx)cVar1._M_value;
  }
  __assert_fail("n >= 0 && n < K",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/test/../lib/transforms.h"
                ,0x11,"cmplx klogic::transform::discrete(int) [K = 3]");
}

Assistant:

cmplx discrete(int n) {
            assert(n >= 0 && n < K);

            return epsilon(n, K);
        }